

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O3

LY_ERR lyd_move_nodes(lyd_node *parent,lyd_node **first_dst_p,lyd_node *first_src)

{
  lysc_node *plVar1;
  long lVar2;
  lyd_node *plVar3;
  lyd_node *plVar4;
  ly_bool lVar5;
  LY_ERR LVar6;
  lys_module *plVar7;
  lyd_node *node;
  lyd_node *first_dst;
  lyd_node *next;
  lyd_node *local_50;
  lyd_node *local_48;
  lyd_node *local_40;
  lyd_node *local_38;
  
  if ((parent == (lyd_node *)0x0 && first_dst_p == (lyd_node **)0x0) ||
     (first_src->prev->next != (lyd_node *)0x0)) {
    __assert_fail("(parent || first_dst_p) && first_src && !first_src->prev->next",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data.c"
                  ,0x3c4,
                  "LY_ERR lyd_move_nodes(struct lyd_node *, struct lyd_node **, struct lyd_node *)")
    ;
  }
  local_50 = first_src;
  if ((first_dst_p != (lyd_node **)0x0) && (plVar4 = *first_dst_p, *first_dst_p != (lyd_node *)0x0))
  goto LAB_00120764;
  if (parent != (lyd_node *)0x0) {
    plVar1 = parent->schema;
    if (plVar1 == (lysc_node *)0x0) {
      plVar4 = *(lyd_node **)(parent + 1);
      if (*(lyd_node **)(parent + 1) != (lyd_node *)0x0) goto LAB_00120764;
LAB_001208a6:
      local_48 = (lyd_node *)0x0;
      lVar2._0_4_ = parent[1].hash;
      lVar2._4_4_ = parent[1].flags;
      if (lVar2 != 0) goto LAB_001209ac;
    }
    else {
      if (((plVar1->nodetype & 0x711) != 0) &&
         (plVar4 = *(lyd_node **)(parent + 1), *(lyd_node **)(parent + 1) != (lyd_node *)0x0)) {
LAB_00120764:
        local_48 = plVar4;
        if ((local_48->prev->next != (lyd_node *)0x0) ||
           (first_src->parent != (lyd_node_inner *)0x0)) {
          __assert_fail("first_dst && *first_dst && !(*first_dst)->prev->next && first_src && !first_src->prev->next && !first_src->parent"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data.c"
                        ,0x3a0,
                        "LY_ERR lyd_move_nodes_by_schema(struct lyd_node **, struct lyd_node *)");
        }
        do {
          lVar5 = lyds_is_supported(first_src);
          if ((lVar5 == '\0') ||
             (LVar6 = lyd_find_sibling_schema(local_48,first_src->schema,&local_38),
             LVar6 != LY_SUCCESS)) {
LAB_001207b9:
            LVar6 = lyd_move_nodes_ordby_schema(&local_48,first_src,&local_40);
            plVar4 = local_48;
            if (LVar6 != LY_SUCCESS) goto LAB_001208cf;
          }
          else {
            LVar6 = lyds_merge(&local_48,&local_38,&local_50,first_src,&local_40);
            if (LVar6 != LY_SUCCESS) {
              if (local_50->schema == (lysc_node *)0x0) {
                plVar7 = (lys_module *)&local_50[2].schema;
              }
              else {
                plVar7 = local_50->schema->module;
              }
              ly_log(plVar7->ctx,LY_LLWRN,LY_SUCCESS,"Data in \"%s\" are not sorted.",
                     local_38->schema->name);
              first_src = local_40;
              goto LAB_001207b9;
            }
          }
          first_src = local_40;
        } while (local_40 != (lyd_node *)0x0);
        LVar6 = LY_SUCCESS;
        plVar4 = local_48;
        goto LAB_001208cf;
      }
      local_48 = (lyd_node *)0x0;
      if ((plVar1->nodetype & 0x711) != 0) goto LAB_001208a6;
    }
  }
  if (first_src->parent != (lyd_node_inner *)0x0) {
LAB_001209ac:
    __assert_fail("!lyd_child(parent) && first_src && !first_src->prev->next && !first_src->parent",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data.c"
                  ,0x378,"LY_ERR lyd_move_nodes_at_once(struct lyd_node *, struct lyd_node *)");
  }
  LVar6 = lyd_unlink_check(first_src);
  plVar4 = first_src;
  if (LVar6 == LY_SUCCESS) {
    node = first_src->next;
    local_40 = first_src;
    lyd_unlink_ignore_lyds(&local_50,first_src);
    if (parent != (lyd_node *)0x0) {
      lyd_insert_only_child(parent,first_src);
      lyd_insert_hash(first_src);
    }
    LVar6 = LY_SUCCESS;
    plVar4 = first_src;
    if (node != (lyd_node *)0x0) {
      do {
        plVar3 = node->next;
        LVar6 = lyd_unlink_check(node);
        plVar4 = first_src;
        if (LVar6 != LY_SUCCESS) break;
        lyd_unlink_ignore_lyds(&local_50,node);
        lyd_insert_after_node(&local_40,local_40->prev,node);
        lyd_insert_hash(node);
        node = plVar3;
        LVar6 = LY_SUCCESS;
        plVar4 = first_src;
      } while (plVar3 != (lyd_node *)0x0);
    }
  }
LAB_001208cf:
  local_48 = plVar4;
  if (first_dst_p != (lyd_node **)0x0) {
    *first_dst_p = local_48;
  }
  return LVar6;
}

Assistant:

static LY_ERR
lyd_move_nodes(struct lyd_node *parent, struct lyd_node **first_dst_p, struct lyd_node *first_src)
{
    LY_ERR ret;
    struct lyd_node *first_dst;

    assert((parent || first_dst_p) && first_src && !first_src->prev->next);

    if (!first_dst_p || !*first_dst_p) {
        first_dst = lyd_child(parent);
    } else {
        first_dst = *first_dst_p;
    }

    if (first_dst) {
        ret = lyd_move_nodes_by_schema(&first_dst, first_src);
    } else {
        ret = lyd_move_nodes_at_once(parent, first_src);
        first_dst = first_src;
    }

    if (first_dst_p) {
        *first_dst_p = first_dst;
    }

    return ret;
}